

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

void __thiscall Kvm::initialize(Kvm *this)

{
  Value *pVVar1;
  Kgc *this_00;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  Kvm *local_10;
  Kvm *this_local;
  
  local_10 = this;
  pVVar1 = makeNil(this);
  this->NIL = pVVar1;
  this_00 = &this->gc_;
  Kgc::pushStackRoot(this_00,this->NIL);
  pVVar1 = makeBool(this,false);
  this->FALSE = pVVar1;
  Kgc::pushStackRoot(this_00,this->FALSE);
  pVVar1 = makeBool(this,true);
  this->TRUE = pVVar1;
  Kgc::pushStackRoot(this_00,this->TRUE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"quote",&local_31);
  pVVar1 = makeSymbol(this,&local_30);
  this->QUOTE = pVVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  Kgc::pushStackRoot(&this->gc_,this->QUOTE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"define",&local_69);
  pVVar1 = makeSymbol(this,&local_68);
  this->DEFINE = pVVar1;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  Kgc::pushStackRoot(&this->gc_,this->DEFINE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"set!",&local_91);
  pVVar1 = makeSymbol(this,&local_90);
  this->SET = pVVar1;
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  Kgc::pushStackRoot(&this->gc_,this->SET);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"ok",&local_b9);
  pVVar1 = makeSymbol(this,&local_b8);
  this->OK = pVVar1;
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  Kgc::pushStackRoot(&this->gc_,this->OK);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"if",&local_e1);
  pVVar1 = makeSymbol(this,&local_e0);
  this->IF = pVVar1;
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  Kgc::pushStackRoot(&this->gc_,this->IF);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"lambda",&local_109);
  pVVar1 = makeSymbol(this,&local_108);
  this->LAMBDA = pVVar1;
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  Kgc::pushStackRoot(&this->gc_,this->LAMBDA);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"begin",&local_131);
  pVVar1 = makeSymbol(this,&local_130);
  this->BEGIN = pVVar1;
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  Kgc::pushStackRoot(&this->gc_,this->BEGIN);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"cond",&local_159);
  pVVar1 = makeSymbol(this,&local_158);
  this->COND = pVVar1;
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  Kgc::pushStackRoot(&this->gc_,this->COND);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"else",&local_181);
  pVVar1 = makeSymbol(this,&local_180);
  this->ELSE = pVVar1;
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  Kgc::pushStackRoot(&this->gc_,this->ELSE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"let",&local_1a9);
  pVVar1 = makeSymbol(this,&local_1a8);
  this->LET = pVVar1;
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  Kgc::pushStackRoot(&this->gc_,this->LET);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"and",&local_1d1);
  pVVar1 = makeSymbol(this,&local_1d0);
  this->AND = pVVar1;
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  Kgc::pushStackRoot(&this->gc_,this->AND);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"or",&local_1f9);
  pVVar1 = makeSymbol(this,&local_1f8);
  this->OR = pVVar1;
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  Kgc::pushStackRoot(&this->gc_,this->OR);
  pVVar1 = makeEofObject(this);
  this->EOFOBJ = pVVar1;
  Kgc::pushStackRoot(&this->gc_,this->EOFOBJ);
  this->EMPTY_ENV = this->NIL;
  pVVar1 = makeEnvironment(this);
  this->GLOBAL_ENV = pVVar1;
  Kgc::pushStackRoot(&this->gc_,this->GLOBAL_ENV);
  return;
}

Assistant:

void Kvm::initialize()
{
    NIL   = makeNil();
    GC_PROTECT(NIL);
    
    FALSE = makeBool(false);
    GC_PROTECT(FALSE);
    
    TRUE  = makeBool(true);
    GC_PROTECT(TRUE);
    
    QUOTE = makeSymbol("quote");
    GC_PROTECT(QUOTE);
    
    DEFINE= makeSymbol("define");
    GC_PROTECT(DEFINE);
    
    SET   = makeSymbol("set!");
    GC_PROTECT(SET);
    
    OK    = makeSymbol("ok");
    GC_PROTECT(OK);
    
    IF    = makeSymbol("if");
    GC_PROTECT(IF);
    
    LAMBDA= makeSymbol("lambda");
    GC_PROTECT(LAMBDA);
    
    BEGIN = makeSymbol("begin");
    GC_PROTECT(BEGIN);
    
    COND  = makeSymbol("cond");
    GC_PROTECT(COND);
    
    ELSE  = makeSymbol("else");
    GC_PROTECT(ELSE);
    
    LET   = makeSymbol("let");
    GC_PROTECT(LET);
    
    AND   = makeSymbol("and");
    GC_PROTECT(AND);
    
    OR    = makeSymbol("or");
    GC_PROTECT(OR);
    
    EOFOBJ= makeEofObject();
    GC_PROTECT(EOFOBJ);
    
    EMPTY_ENV = NIL; // already protected
    GLOBAL_ENV= makeEnvironment();
    GC_PROTECT(GLOBAL_ENV);
}